

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

axbStatus_t initMatSparseRandom(axbMat_s *A,size_t nonzeros_per_row)

{
  size_t sVar1;
  void *__ptr;
  axbStatus_t aVar2;
  int iVar3;
  undefined4 *row_markers;
  void *values;
  ulong uVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  size_t rows;
  void *local_78;
  size_t local_70;
  axbMat_s *local_68;
  undefined4 *local_60;
  long local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  size_t cols;
  
  aVar2 = axbMatGetSizes(A,&rows,&cols);
  if (aVar2 == 0) {
    sVar6 = rows * nonzeros_per_row;
    local_68 = A;
    printf("initMatSparseRandom(): Initializing sparse matrix with %ld rows and %ld nonzeros\n",rows
           ,sVar6);
    sVar1 = rows;
    row_markers = (undefined4 *)malloc(rows * 4 + 4);
    local_78 = malloc(sVar6 * 4);
    local_70 = sVar6;
    values = malloc(sVar6 * 8);
    *row_markers = 0;
    if (sVar1 != 0) {
      uVar7 = sVar1 / nonzeros_per_row >> 1;
      uVar4 = 0;
      local_48 = -(ulong)(nonzeros_per_row == 0) - nonzeros_per_row;
      lVar10 = 0;
      local_60 = row_markers;
      do {
        local_40 = uVar4 >> 1;
        lVar11 = (long)(int)lVar10;
        lVar8 = 0;
        iVar9 = 0;
        local_58 = lVar10;
        local_50 = uVar4;
        do {
          iVar5 = iVar9 * (int)uVar7 + (int)local_40;
          iVar3 = rand();
          *(int *)((long)local_78 + lVar11 * 4) = (int)((ulong)(long)iVar3 % uVar7) + iVar5;
          iVar3 = rand();
          *(double *)((long)values + lVar11 * 8) = (double)(iVar3 % 0x3ff + -500) / 300.0 + 1.0;
          lVar11 = lVar11 + 1;
          iVar9 = iVar9 + 1;
          lVar8 = lVar8 + -1;
        } while (local_48 != lVar8);
        local_60[local_50 + 1] = (int)local_58 - (int)lVar8;
        uVar4 = local_50 + 1;
        row_markers = local_60;
        lVar10 = lVar11;
      } while (uVar4 < rows);
    }
    __ptr = local_78;
    aVar2 = axbMatSetValuesCSR(local_68,row_markers,AXB_INT_32,local_78,AXB_INT_32,values,
                               AXB_REAL_DOUBLE,local_70);
    if (aVar2 == 0) {
      free(row_markers);
      free(__ptr);
      free(values);
      aVar2 = 0;
    }
    else {
      initMatSparseRandom_cold_2();
    }
  }
  else {
    initMatSparseRandom_cold_1();
  }
  return aVar2;
}

Assistant:

axbStatus_t initMatSparseRandom(struct axbMat_s *A, size_t nonzeros_per_row)
{
  size_t rows, cols;
  AXB_ERR_CHECK(axbMatGetSizes(A, &rows, &cols));
  size_t nonzeros = rows * nonzeros_per_row;

  printf("initMatSparseRandom(): Initializing sparse matrix with %ld rows and %ld nonzeros\n", rows, nonzeros);

  int    *host_rows = malloc(sizeof(int)   *(rows+1));
  int    *host_cols = malloc(sizeof(int)   *(nonzeros));
  double *host_vals = malloc(sizeof(double)*(nonzeros));

  // populate
  host_rows[0] = 0;
  int nnz_index = 0;
  size_t col_inc = rows / nonzeros_per_row / 2;
  for (size_t i=0; i<rows; ++i) {
    for (size_t j=0; j<nonzeros_per_row; ++j) {
      host_cols[nnz_index] = i/2 + col_inc * j + rand() % col_inc;
      host_vals[nnz_index] = 1.0 + (rand() % 1023 - 500.0) / 300.0;
      ++nnz_index;
    }
    host_rows[i+1] = nnz_index;
  }

  // copy over to matrix:
  AXB_ERR_CHECK(axbMatSetValuesCSR(A, host_rows, AXB_INT_32, host_cols, AXB_INT_32, host_vals, AXB_REAL_DOUBLE, nonzeros));

  free(host_rows);
  free(host_cols);
  free(host_vals);
  return 0;
}